

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O2

void __thiscall
iutest::detail::iuValuesInParamsGenerator<std::tuple<bool,int>>::
iuValuesInParamsGenerator<std::tuple<bool,int>,1ul>
          (iuValuesInParamsGenerator<std::tuple<bool,int>> *this,tuple<bool,_int> (*values) [1])

{
  *(undefined ***)this = &PTR__iuValuesInParamsGenerator_00396838;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  std::vector<std::tuple<bool,int>,std::allocator<std::tuple<bool,int>>>::
  insert<std::tuple<bool,int>const*,void>
            ((vector<std::tuple<bool,int>,std::allocator<std::tuple<bool,int>>> *)(this + 8),
             (const_iterator)0x0,*values,values[1]);
  return;
}

Assistant:

explicit iuValuesInParamsGenerator(const TT (&values)[SIZE])
    {
        m_values.insert(m_values.end(), values, values + SIZE);
    }